

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void __thiscall
ByteCodeGenerator::EmitPropLoadThis
          (ByteCodeGenerator *this,RegSlot lhsLocation,ParseNodeSpecialName *pnodeSpecialName,
          FuncInfo *funcInfo,bool chkUndecl)

{
  Symbol *sym;
  bool bVar1;
  
  sym = (pnodeSpecialName->super_ParseNodeName).sym;
  if (sym == (Symbol *)0x0) {
    bVar1 = ShouldLoadConstThis(this,funcInfo);
    if (bVar1) {
      Js::ByteCodeWriter::Reg2(&this->m_writer,Ld_A,lhsLocation,funcInfo->thisConstantRegister);
      return;
    }
    EmitPropLoad(this,lhsLocation,(pnodeSpecialName->super_ParseNodeName).sym,
                 (pnodeSpecialName->super_ParseNodeName).pid,funcInfo,true);
    if (!chkUndecl) {
      return;
    }
  }
  else {
    EmitPropLoad(this,lhsLocation,sym,(pnodeSpecialName->super_ParseNodeName).pid,funcInfo,true);
    if ((sym->field_0x42 & chkUndecl) == 0) {
      return;
    }
  }
  Js::ByteCodeWriter::Reg1(&this->m_writer,ChkUndecl,lhsLocation);
  return;
}

Assistant:

void ByteCodeGenerator::EmitPropLoadThis(Js::RegSlot lhsLocation, ParseNodeSpecialName *pnodeSpecialName, FuncInfo *funcInfo, bool chkUndecl)
{
    Symbol* sym = pnodeSpecialName->sym;

    if (!sym && this->ShouldLoadConstThis(funcInfo))
    {
        this->Writer()->Reg2(Js::OpCode::Ld_A, lhsLocation, funcInfo->thisConstantRegister);
    }
    else
    {
        this->EmitPropLoad(lhsLocation, pnodeSpecialName->sym, pnodeSpecialName->pid, funcInfo, true);

        if ((!sym || sym->GetNeedDeclaration()) && chkUndecl)
        {
            this->Writer()->Reg1(Js::OpCode::ChkUndecl, lhsLocation);
        }
    }
}